

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_TELEPORT_TO(effect_handler_context_t_conflict *context)

{
  bool bVar1;
  chunk_conflict *c;
  player *p;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  wchar_t wVar6;
  monster *pmVar7;
  monster *mon;
  loc lVar8;
  loc grid;
  square *psVar9;
  int x_spread;
  int iVar10;
  wchar_t dir;
  loc aim;
  
  dir = L'\x05';
  pmVar7 = monster_target_monster(context);
  context->ident = true;
  if (player->upkeep->arena_level != false) {
    return true;
  }
  if ((context->origin).what == SRC_MONSTER) {
    mon = cave_monster(cave,(context->origin).which.grid.x);
    if (mon == (monster *)0x0) {
      __assert_fail("mon",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                    ,0xb1f,"_Bool effect_handler_TELEPORT_TO(effect_handler_context_t *)");
    }
  }
  else {
    mon = (monster *)0x0;
  }
  if ((pmVar7 == (monster *)0x0) && (pmVar7 = mon, context->subtype == 0)) {
    if ((mon != (monster *)0x0) && (_Var2 = monster_is_decoyed(mon), c = cave, _Var2)) {
      lVar8 = cave_find_decoy(cave);
      square_destroy_decoy(c,lVar8);
      return true;
    }
    lVar8.x = (player->grid).x;
    lVar8.y = (player->grid).y;
    _Var2 = square_isno_teleport(cave,lVar8);
    if (_Var2) {
      msg("Teleportation forbidden!");
      return true;
    }
    _Var3 = player_of_has(player,L'\x1d');
    _Var2 = true;
    if (_Var3) {
      equip_learn_flag(player,L'\x1d');
      msg("Teleportation forbidden!");
      return true;
    }
  }
  else {
    lVar8.x = (pmVar7->grid).x;
    lVar8.y = (pmVar7->grid).y;
    _Var2 = false;
  }
  if ((context->y == 0) || (context->x == 0)) {
    if (mon == (monster *)0x0) {
      do {
        _Var3 = get_aim_dir(&dir);
        if (!_Var3) {
          return false;
        }
        target_get((loc_conflict *)&aim);
        if (dir != L'\x05') goto LAB_0013eae8;
        _Var3 = los(cave,player->grid,(loc_conflict)aim);
        if (!_Var3) {
          target_set_location(L'\0',L'\0');
          msg("Target grid must be in view!");
        }
        if (dir != L'\x05') goto LAB_0013eae8;
        _Var3 = target_okay();
      } while (!_Var3);
      if (dir == L'\x05') {
        target_get((loc_conflict *)&aim);
      }
      else {
LAB_0013eae8:
        aim = (loc)loc_offset((loc_conflict)lVar8,(int)ddx[dir],(int)ddy[dir]);
      }
      _Var3 = square_isvault(cave,aim);
      x_spread = 0;
      if (_Var3) {
        x_spread = 10;
      }
      bVar1 = true;
      goto LAB_0013eb2d;
    }
    if (context->subtype != 0) {
      aim.x = (player->grid).x;
      aim.y = (player->grid).y;
      x_spread = 2;
      bVar1 = false;
      goto LAB_0013eb2d;
    }
    aim.x = (mon->grid).x;
    aim.y = (mon->grid).y;
  }
  else {
    aim = (loc)loc(context->x,context->y);
  }
  bVar1 = false;
  x_spread = 0;
LAB_0013eb2d:
  iVar10 = 0;
  while( true ) {
    do {
      grid = (loc)rand_loc((loc_conflict)aim,x_spread,x_spread);
      _Var3 = square_in_bounds_fully(cave,grid);
    } while (!_Var3);
    _Var3 = has_teleport_destination_prereqs((chunk *)cave,grid,_Var2);
    if (_Var3) break;
    iVar4 = (x_spread * 4 + 4) * x_spread;
    iVar5 = iVar10 + 1;
    if (iVar4 < iVar10) {
      iVar5 = 0;
    }
    x_spread = (uint)(iVar4 < iVar10) + x_spread;
    iVar10 = iVar5;
  }
  if ((bVar1) &&
     (_Var3 = flag_has_dbg((player->state).pflags,10,0x37,"player->state.pflags","(PF_PHASEWALK)"),
     p = player, _Var3)) {
    wVar6 = distance((loc_conflict)lVar8,(loc_conflict)grid);
    player_add_speed_boost(p,wVar6 + L'\x14');
  }
  sound(10);
  monster_swap(lVar8,grid);
  if (_Var2 != false) {
    player_handle_post_move(player,true,(context->origin).what == SRC_MONSTER);
  }
  if (bVar1) {
    target_set_location(L'\0',L'\0');
  }
  psVar9 = square(cave,grid);
  flag_off(psVar9->info,3,0x12);
  handle_stuff(player);
  return true;
}

Assistant:

bool effect_handler_TELEPORT_TO(effect_handler_context_t *context)
{
	struct monster *mon = NULL;
	struct loc start, aim, land;
	int dis = 0, ctr = 0, dir = DIR_TARGET;
	struct monster *t_mon = monster_target_monster(context);
	bool friendly = false;
	bool dim_door = false;
	bool player_moves = false;

	context->ident = true;

	/* No teleporting in arena levels */
	if (player->upkeep->arena_level) return true;

	if (context->origin.what == SRC_MONSTER) {
		mon = cave_monster(cave, context->origin.which.monster);
		assert(mon);
	}

	/* Where are we coming from? */
	if (t_mon) {
		/* Monster being teleported */
		start = t_mon->grid;
	} else if (context->subtype) {
		/* Monster teleporting to the player */
		start = mon->grid;
	} else {
		/* Targeted decoys get destroyed */
		if (mon && monster_is_decoyed(mon)) {
			square_destroy_decoy(cave, cave_find_decoy(cave));
			return true;
		}

		/* Player being teleported */
		player_moves = true;
		start = player->grid;

		/* Check for a no teleport grid */
		if (square_isno_teleport(cave, start)) {
			msg("Teleportation forbidden!");
			return true;
		}

		/* Check for a no teleport curse */
		if (player_of_has(player, OF_NO_TELEPORT)) {
			equip_learn_flag(player, OF_NO_TELEPORT);
			msg("Teleportation forbidden!");
			return true;
		}
	}

	/* Where are we going? */
	if (context->y && context->x) {
		/* Effect was given co-ordinates */
		aim = loc(context->x, context->y);
	} else if (mon) {
		/* Spell cast by monster */
		if (context->subtype) {
			/* Monster teleporting to player */
			aim = player->grid;
			dis = 2;
		} else {
			/* Player being teleported to monster */
			aim = mon->grid;
		}
	} else {
		friendly = true;

		/* Player choice */
		do {
			if (!get_aim_dir(&dir)) return false;

			/* Insist on LoS */
			target_get(&aim);
			if (dir == DIR_TARGET && !los(cave, player->grid, aim)) {
				/* Set a silly target */
				target_set_location(0, 0);
				msg("Target grid must be in view!");
			}
		} while (dir == DIR_TARGET && !target_okay());

		if (dir == DIR_TARGET)
			target_get(&aim);
		else
			aim = loc_offset(start, ddx[dir], ddy[dir]);

		/* Randomise the landing a bit if it's a vault */
		if (square_isvault(cave, aim)) dis = 10;
		dim_door = true;
	}

	/* Find a usable location */
	while (1) {
		/* Pick a nearby legal location */
		while (1) {
			land = rand_loc(aim, dis, dis);
			if (square_in_bounds_fully(cave, land)) break;
		}

		if (has_teleport_destination_prereqs(cave, land,
				player_moves)) break;

		/* Occasionally advance the distance */
		if (++ctr > (4 * dis * dis + 4 * dis + 1)) {
			ctr = 0;
			dis++;
		}
	}

	/* Check for specialty speed boost on friendly teleports */
	if (friendly && player_has(player, PF_PHASEWALK)) {
		player_add_speed_boost(player, 20 + distance(start, land));
	}

	/* Sound */
	sound(MSG_TELEPORT);

	/* Move player or monster */
	monster_swap(start, land);
	if (player_moves) {
		player_handle_post_move(player, true,
			context->origin.what == SRC_MONSTER);
	}

	/* Cancel target if necessary */
	if (dim_door) {
		target_set_location(0, 0);
	}

	/* Clear any projection marker to prevent double processing */
	sqinfo_off(square(cave, land)->info, SQUARE_PROJECT);

	/* Lots of updates after monster_swap() */
	handle_stuff(player);

	return true;
}